

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O0

void __thiscall helics::Filter::Filter(Filter *this,Core *core,string_view filtName)

{
  string_view actName;
  undefined4 uVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long *in_RSI;
  undefined8 *in_RDI;
  Core *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined8 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  InterfaceHandle in_stack_ffffffffffffff94;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_38;
  undefined8 uStack_30;
  InterfaceHandle local_24;
  long *local_20;
  undefined8 local_10;
  undefined8 uStack_8;
  
  local_24.hid = 0;
  local_20 = in_RSI;
  local_10 = in_RDX;
  uStack_8 = in_RCX;
  InterfaceHandle::InterfaceHandle(&local_24);
  local_38 = local_10;
  uStack_30 = uStack_8;
  actName._M_str._0_4_ = in_stack_ffffffffffffff88;
  actName._M_len = in_stack_ffffffffffffff80;
  actName._M_str._4_4_ = in_stack_ffffffffffffff8c;
  Interface::Interface
            ((Interface *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             in_stack_ffffffffffffff70,in_stack_ffffffffffffff94,actName);
  *in_RDI = &PTR__Filter_009502c0;
  *(undefined1 *)(in_RDI + 7) = 0;
  *(undefined1 *)((long)in_RDI + 0x39) = 0;
  std::shared_ptr<helics::FilterOperations>::shared_ptr
            ((shared_ptr<helics::FilterOperations> *)0x310d68);
  local_58 = local_10;
  uStack_50 = uStack_8;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff88);
  uVar1 = (**(code **)(*local_20 + 0x1d8))
                    (local_20,local_58,uStack_50,local_68._M_len,local_68._M_str);
  *(undefined4 *)(in_RDI + 2) = uVar1;
  return;
}

Assistant:

Filter::Filter(Core* core, std::string_view filtName): Interface(core, InterfaceHandle(), filtName)
{
    handle = core->registerFilter(filtName, std::string_view{}, std::string_view{});
}